

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

complex<double> * c8mat_test(int n)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  double dVar6;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  ulong local_50;
  long local_48;
  complex<double> *local_40;
  double local_38;
  
  uVar3 = (ulong)(uint)(n * n) << 4;
  local_40 = (complex<double> *)operator_new__(uVar3);
  if (n != 0) {
    memset(local_40,0,uVar3);
  }
  local_38 = (double)n;
  uVar3 = 0;
  local_50 = 0;
  if (0 < n) {
    local_50 = (ulong)(uint)n;
  }
  lVar4 = (long)local_40->_M_value + 8;
  local_48 = (long)n << 4;
  local_68 = SQRT(local_38);
  for (; uVar3 != local_50; uVar3 = uVar3 + 1) {
    iVar1 = 0;
    for (lVar2 = 0; (ulong)(uint)n << 4 != lVar2; lVar2 = lVar2 + 0x10) {
      local_70 = ((double)iVar1 * 6.283185307179586) / local_38;
      dVar6 = local_70 * 0.0;
      local_78 = dVar6;
      std::exp<double>((complex<double> *)&local_78);
      dVar5 = local_68;
      local_60 = extraout_XMM0_Qa;
      if (local_38 < 0.0) {
        local_58 = dVar6;
        dVar5 = sqrt(local_38);
        dVar6 = local_58;
      }
      *(double *)(lVar4 + lVar2 + -8) = local_60 / dVar5;
      *(double *)(lVar4 + lVar2) = dVar6 / dVar5;
      iVar1 = iVar1 + (int)uVar3;
    }
    lVar4 = lVar4 + local_48;
  }
  return local_40;
}

Assistant:

complex <double> *c8mat_test ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    C8MAT_TEST returns a test matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Output, complex <double> C8MAT_TEST[N*N], the matrix.
//
{
  complex <double> *a;
  double angle;
  complex <double> I = complex <double> ( 0.0, 1.0 );
  int i;
  int j;
  double pi = 3.141592653589793;

  a = new complex <double>[n*n];

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < n; i++ )
    {
      angle = 2.0 * pi * static_cast<double>(i * j) / static_cast<double>(n);

      a[i+j*n] = exp ( I * angle ) / sqrt ( static_cast<double>(n) );
    }
  }
  return a;
}